

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EditorInterface.cpp
# Opt level: O2

shared_ptr<gui::DialogBox> __thiscall EditorInterface::createOverwriteDialog(EditorInterface *this)

{
  Theme *pTVar1;
  _func_int **pp_Var2;
  DialogBox *pDVar3;
  _func_int **pp_Var4;
  element_type *this_00;
  element_type *this_01;
  size_type sVar5;
  _Link_type __p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<gui::Button> *in_RSI;
  map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
  *this_02;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar6;
  shared_ptr<gui::DialogBox> sVar7;
  _Any_data local_138;
  code *local_128;
  code *local_120;
  locale local_118 [8];
  shared_ptr<gui::Button> overwriteCancelButton;
  shared_ptr<gui::Label> overwriteLabel;
  shared_ptr<gui::Button> overwriteSubmitButton;
  shared_ptr<gui::Label> overwriteTitle;
  undefined1 local_c0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  undefined1 local_a0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  undefined1 local_80 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<gui::Widget,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  pTVar1 = (Theme *)in_RSI[4].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  std::locale::locale((locale *)&overwriteTitle);
  sf::String::String((String *)&local_138,"overwriteDialog",(locale *)&overwriteTitle);
  ::gui::DialogBox::create((DialogBox *)local_80,pTVar1,(String *)&local_138);
  debugWidgetCreation<gui::DialogBox>(this,(shared_ptr<gui::DialogBox> *)in_RSI);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_138);
  std::locale::~locale((locale *)&overwriteTitle);
  local_138._M_unused._M_object = (void *)0x42c8000043e10000;
  ::gui::DialogBox::setSize
            ((DialogBox *)(this->super_Drawable)._vptr_Drawable,(Vector2f *)&local_138);
  pp_Var2 = (this->super_Drawable)._vptr_Drawable;
  (**(code **)(*pp_Var2 + 0x18))(pp_Var2,0);
  pp_Var2 = (this->super_Drawable)._vptr_Drawable;
  pTVar1 = (Theme *)in_RSI[4].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  std::locale::locale((locale *)&overwriteLabel);
  sf::String::String((String *)&local_138,"overwriteTitle",(locale *)&overwriteLabel);
  ::gui::Label::create((Label *)(local_a0 + 0x10),pTVar1,(String *)&local_138);
  debugWidgetCreation<gui::Label>
            ((EditorInterface *)&overwriteTitle,(shared_ptr<gui::Label> *)in_RSI);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_138);
  std::locale::~locale((locale *)&overwriteLabel);
  std::locale::locale((locale *)&overwriteLabel);
  sf::String::String((String *)&local_138,"Overwrite File?",(locale *)&overwriteLabel);
  ::gui::Label::setLabel
            (overwriteTitle.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (String *)&local_138);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_138);
  std::locale::~locale((locale *)&overwriteLabel);
  pDVar3 = (DialogBox *)(this->super_Drawable)._vptr_Drawable;
  std::__shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&overwriteTitle.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>);
  ::gui::DialogBox::setTitle(pDVar3,(shared_ptr<gui::Label> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  pTVar1 = (Theme *)in_RSI[4].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  std::locale::locale((locale *)&overwriteSubmitButton);
  sf::String::String((String *)&local_138,"overwriteLabel",(locale *)&overwriteSubmitButton);
  ::gui::Label::create((Label *)local_a0,pTVar1,(String *)&local_138);
  debugWidgetCreation<gui::Label>
            ((EditorInterface *)&overwriteLabel,(shared_ptr<gui::Label> *)in_RSI);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_138);
  std::locale::~locale((locale *)&overwriteSubmitButton);
  this_01 = overwriteLabel.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::locale::locale((locale *)&overwriteSubmitButton);
  sf::String::String((String *)&local_138,"The file already exists, do you want to replace it?",
                     (locale *)&overwriteSubmitButton);
  ::gui::Label::setLabel(this_01,(String *)&local_138);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_138);
  std::locale::~locale((locale *)&overwriteSubmitButton);
  ::gui::Widget::setPosition
            (&(overwriteLabel.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_Widget,10.0,30.0);
  pp_Var4 = (this->super_Drawable)._vptr_Drawable;
  std::__shared_ptr<gui::Widget,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<gui::Label,void>
            (local_50,&overwriteLabel.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*pp_Var4 + 0x10))(pp_Var4,local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  pTVar1 = (Theme *)in_RSI[4].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  std::locale::locale((locale *)&overwriteCancelButton);
  sf::String::String((String *)&local_138,"overwriteSubmitButton",(locale *)&overwriteCancelButton);
  ::gui::Button::create((Button *)(local_c0 + 0x10),pTVar1,(String *)&local_138);
  debugWidgetCreation<gui::Button>((EditorInterface *)&overwriteSubmitButton,in_RSI);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_138);
  std::locale::~locale((locale *)&overwriteCancelButton);
  std::locale::locale((locale *)&overwriteCancelButton);
  sf::String::String((String *)&local_138,"Overwrite",(locale *)&overwriteCancelButton);
  ::gui::Button::setLabel
            (overwriteSubmitButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(String *)&local_138);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_138);
  std::locale::~locale((locale *)&overwriteCancelButton);
  pDVar3 = (DialogBox *)(this->super_Drawable)._vptr_Drawable;
  std::__shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,
             &overwriteSubmitButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>);
  ::gui::DialogBox::setSubmitButton(pDVar3,0,(shared_ptr<gui::Button> *)&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  pTVar1 = (Theme *)in_RSI[4].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  std::locale::locale(local_118);
  sf::String::String((String *)&local_138,"overwriteCancelButton",local_118);
  ::gui::Button::create((Button *)local_c0,pTVar1,(String *)&local_138);
  debugWidgetCreation<gui::Button>((EditorInterface *)&overwriteCancelButton,in_RSI);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_138);
  std::locale::~locale(local_118);
  this_00 = overwriteCancelButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::locale::locale(local_118);
  sf::String::String((String *)&local_138,"Cancel",local_118);
  ::gui::Button::setLabel(this_00,(String *)&local_138);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_138);
  std::locale::~locale(local_118);
  this_02 = &((overwriteCancelButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->onClick).callbacks_;
  while( true ) {
    sVar5 = std::
            map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
            ::count(this_02,(key_type_conflict1 *)&::gui::priv::signalIdCounter);
    if (sVar5 == 0) break;
    ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
  }
  __p = std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
        ::_M_get_node(&this_02->_M_t);
  *(int *)(__p->_M_storage)._M_storage = ::gui::priv::signalIdCounter;
  local_120 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:603:44)>
              ::_M_invoke;
  local_128 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:603:44)>
              ::_M_manager;
  local_138._8_8_ = pp_Var2;
  ::gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>::Callback
            ((Callback<gui::Widget_*,_const_sf::Vector2<float>_&> *)
             ((__p->_M_storage)._M_storage + 8),(function<void_()> *)&local_138);
  std::_Function_base::~_Function_base((_Function_base *)&local_138);
  pVar6 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
          ::_M_get_insert_unique_pos(&this_02->_M_t,(key_type_conflict1 *)&__p->_M_storage);
  if (pVar6.second == (_Base_ptr)0x0) {
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
    ::_M_drop_node(&this_02->_M_t,__p);
  }
  else {
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
    ::_M_insert_node(&this_02->_M_t,pVar6.first,pVar6.second,__p);
  }
  ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
  pDVar3 = (DialogBox *)(this->super_Drawable)._vptr_Drawable;
  std::__shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x10),
             &overwriteCancelButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>);
  ::gui::DialogBox::setCancelButton(pDVar3,1,(shared_ptr<gui::Button> *)(local_80 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&overwriteCancelButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&overwriteSubmitButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&overwriteLabel.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&overwriteTitle.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  sVar7.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar7.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<gui::DialogBox>)
         sVar7.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<gui::DialogBox> EditorInterface::createOverwriteDialog() const {
    auto overwriteDialog = debugWidgetCreation(gui::DialogBox::create(*theme_, "overwriteDialog"));
    overwriteDialog->setSize({450.0f, 100.0f});
    overwriteDialog->setVisible(false);
    auto overwriteDialogPtr = overwriteDialog.get();

    auto overwriteTitle = debugWidgetCreation(gui::Label::create(*theme_, "overwriteTitle"));
    overwriteTitle->setLabel("Overwrite File?");
    overwriteDialog->setTitle(overwriteTitle);

    auto overwriteLabel = debugWidgetCreation(gui::Label::create(*theme_, "overwriteLabel"));
    overwriteLabel->setLabel("The file already exists, do you want to replace it?");
    overwriteLabel->setPosition(10.0f, 30.0f);
    overwriteDialog->addChild(overwriteLabel);

    auto overwriteSubmitButton = debugWidgetCreation(gui::Button::create(*theme_, "overwriteSubmitButton"));
    overwriteSubmitButton->setLabel("Overwrite");
    overwriteDialog->setSubmitButton(0, overwriteSubmitButton);

    auto overwriteCancelButton = debugWidgetCreation(gui::Button::create(*theme_, "overwriteCancelButton"));
    overwriteCancelButton->setLabel("Cancel");
    overwriteCancelButton->onClick.connect([this,overwriteDialogPtr]() {
        overwriteDialogPtr->setVisible(false);
        modalBackground_->setVisible(false);
    });
    overwriteDialog->setCancelButton(1, overwriteCancelButton);

    return overwriteDialog;
}